

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5StorageLoadTotals(Fts5Storage *p,int bCache)

{
  int iVar1;
  Fts5Index *p_00;
  byte bVar2;
  uint uVar3;
  Fts5Data *p_01;
  ulong uVar4;
  u64 *v;
  bool bVar5;
  
  if (p->bTotalsValid != 0) {
    return 0;
  }
  p_00 = p->pIndex;
  v = (u64 *)p->aTotalSize;
  iVar1 = p_00->pConfig->nCol;
  p->nTotalRow = 0;
  memset(v,0,(long)iVar1 * 8);
  p_01 = fts5DataRead(p_00,1);
  if ((((p_00->rc == 0) && (p_01->nn != 0)) &&
      (bVar2 = sqlite3Fts5GetVarint(p_01->p,(u64 *)&p->nTotalRow), 0 < iVar1)) &&
     (uVar3 = (uint)bVar2, (int)(uint)bVar2 < p_01->nn)) {
    uVar4 = 1;
    do {
      bVar2 = sqlite3Fts5GetVarint(p_01->p + uVar3,v);
      uVar3 = bVar2 + uVar3;
      if (p_01->nn <= (int)uVar3) break;
      v = v + 1;
      bVar5 = uVar4 < (ulong)(long)iVar1;
      uVar4 = uVar4 + 1;
    } while (bVar5);
  }
  sqlite3_free(p_01);
  iVar1 = p_00->rc;
  p_00->rc = 0;
  p->bTotalsValid = bCache;
  return iVar1;
}

Assistant:

static int fts5StorageLoadTotals(Fts5Storage *p, int bCache){
  int rc = SQLITE_OK;
  if( p->bTotalsValid==0 ){
    rc = sqlite3Fts5IndexGetAverages(p->pIndex, &p->nTotalRow, p->aTotalSize);
    p->bTotalsValid = bCache;
  }
  return rc;
}